

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioStoreScript(char *script)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  pthread_t *ppVar4;
  uint *puVar5;
  uint uVar6;
  char *__format;
  FILE *pFVar7;
  
  pFVar7 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar7,"%s %s: script=[%s]\n",myTimeStamp::buf,"gpioStoreScript",script);
  }
  pFVar7 = _stderr;
  if (libInitialised == '\0') {
    iVar1 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    __format = "%s %s: pigpio uninitialised, call gpioInitialise()\n";
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&gpioStoreScript::mutex);
    puVar5 = &gpioScript[0].state;
    uVar3 = 0xffffffffffffffff;
    for (uVar2 = 0; uVar2 != 0x20; uVar2 = uVar2 + 1) {
      if (*puVar5 == 0) {
        *puVar5 = 1;
        uVar3 = uVar2 & 0xffffffff;
        break;
      }
      puVar5 = puVar5 + 0x2c;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&gpioStoreScript::mutex);
    pFVar7 = _stderr;
    uVar6 = (uint)uVar3;
    if (-1 < (int)uVar6) {
      uVar3 = uVar3 & 0xffffffff;
      iVar1 = cmdParseScript(script,&gpioScript[uVar3].script,0);
      if (iVar1 != 0) {
        free(gpioScript[uVar3].script.par);
        gpioScript[uVar3].script.par = (int *)0x0;
        gpioScript[uVar3].state = 0;
        return iVar1;
      }
      gpioScript[uVar3].request = 0;
      gpioScript[uVar3].run_state = 0;
      pthread_cond_init((pthread_cond_t *)&gpioScript[uVar3].pthCond,(pthread_condattr_t *)0x0);
      pthread_mutex_init((pthread_mutex_t *)&gpioScript[uVar3].pthMutex,(pthread_mutexattr_t *)0x0);
      gpioScript[uVar3].id = uVar6;
      gpioScript[uVar3].state = 2;
      ppVar4 = gpioStartThread(pthScript,gpioScript + uVar3);
      gpioScript[uVar3].pthIdp = ppVar4;
      return uVar6;
    }
    iVar1 = -0x39;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x39;
    }
    myTimeStamp();
    __format = "%s %s: no room for scripts\n";
  }
  fprintf(pFVar7,__format,myTimeStamp::buf,"gpioStoreScript");
  return iVar1;
}

Assistant:

int gpioStoreScript(char *script)
{
   static pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
   gpioScript_t *s;
   int status, slot, i;

   DBG(DBG_USER, "script=[%s]", script);

   CHECK_INITED;

   slot = -1;

   pthread_mutex_lock(&mutex);

   for (i=0; i<PI_MAX_SCRIPTS; i++)
   {
      if (gpioScript[i].state == PI_SCRIPT_FREE)
      {
         slot = i;
         gpioScript[slot].state = PI_SCRIPT_RESERVED;
         break;
      }
   }

   pthread_mutex_unlock(&mutex);

   if (slot < 0) SOFT_ERROR(PI_NO_SCRIPT_ROOM, "no room for scripts");

   s = &gpioScript[slot];

   status = cmdParseScript(script, &s->script, 0);

   if (status == 0)
   {
      s->request   = PI_SCRIPT_HALT;
      s->run_state = PI_SCRIPT_INITING;

      pthread_cond_init(&s->pthCond, NULL);
      pthread_mutex_init(&s->pthMutex, NULL);

      s->id = slot;

      gpioScript[slot].state = PI_SCRIPT_IN_USE;

      s->pthIdp = gpioStartThread(pthScript, s);

      status = slot;
   }
   else
   {
      if (s->script.par) free(s->script.par);
      s->script.par = NULL;
      gpioScript[slot].state = PI_SCRIPT_FREE;
   }

   return status;
}